

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

void __thiscall embree::SceneGraph::GroupNode::remove_mblur(GroupNode *this,bool mblur)

{
  pointer pRVar1;
  ulong uVar2;
  Ref<embree::SceneGraph::Node> local_38;
  long *local_30;
  
  pRVar1 = (this->children).
           super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->children).
      super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pRVar1) {
    uVar2 = 0;
    do {
      local_38.ptr = pRVar1[uVar2].ptr;
      if (local_38.ptr != (Node *)0x0) {
        (*((local_38.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      SceneGraph::remove_mblur((SceneGraph *)&local_30,&local_38,mblur);
      if (local_30 != (long *)0x0) {
        (**(code **)(*local_30 + 0x18))();
      }
      if (local_38.ptr != (Node *)0x0) {
        (*((local_38.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      uVar2 = uVar2 + 1;
      pRVar1 = (this->children).
               super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->children).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3));
  }
  return;
}

Assistant:

void bspline_to_bezier()
      {
        for (size_t i=0; i<children.size(); i++)
          children[i] = convert_bspline_to_bezier(children[i]);
      }